

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutLutBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  float fVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  
  uVar4 = *(uint *)&pCut->field_0x1c;
  iVar3 = 0;
  if (0xffffff < uVar4) {
    if ((uVar4 & 0xff000000) == 0x1000000) {
      *pPerm = '\0';
      if (*(uint *)&pCut->field_0x1c < 0x1000000) {
        __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
      }
      fVar1 = pCut[1].Area;
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
LAB_0041d031:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
    }
    else {
      if (pCut->iCutFunc < 0) {
LAB_0041d050:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = uVar4 >> 0x18;
      uVar5 = 6;
      if (6 < uVar4) {
        uVar5 = uVar4;
      }
      uVar5 = uVar5 * ((uint)pCut->iCutFunc >> 1);
      if (p->vTtPerms[uVar4]->nSize <= (int)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
      }
      iVar3 = *p->pPars->pLutStruct + -0x30;
      if (pCut->uMaskFunc < 1 == iVar3 < (int)uVar4) {
        __assert_fail("(If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0x155,"int If_CutLutBalancePinDelays(If_Man_t *, If_Cut_t *, char *)");
      }
      uVar9 = (ulong)(*(uint *)&pCut->field_0x1c >> 0x18);
      if (0xffffff < *(uint *)&pCut->field_0x1c) {
        pcVar2 = p->vTtPerms[uVar4]->pArray;
        uVar4 = 0;
        uVar6 = 0;
        do {
          if ((iVar3 < (int)uVar9) && (((uint)pCut->uMaskFunc >> (uVar4 & 0x1f) & 1) != 0)) {
            bVar10 = pcVar2[uVar6 + uVar5];
            cVar7 = '\x02';
          }
          else {
            bVar10 = pcVar2[uVar6 + uVar5];
            cVar7 = '\x01';
          }
          if ((char)bVar10 < '\0') goto LAB_0041d050;
          pPerm[bVar10 >> 1] = cVar7;
          uVar6 = uVar6 + 1;
          uVar9 = (ulong)(byte)pCut->field_0x1f;
          uVar4 = uVar4 + 2;
        } while (uVar6 < uVar9);
      }
      if ((int)uVar9 == 0) {
        iVar3 = -1;
      }
      else {
        iVar3 = -1;
        uVar6 = 0;
        do {
          fVar1 = (&pCut[1].Area)[uVar6];
          if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) goto LAB_0041d031;
          iVar8 = (int)pPerm[uVar6] + (int)*(float *)((long)p->vObjs->pArray[(int)fVar1] + 0x5c);
          if (iVar3 <= iVar8) {
            iVar3 = iVar8;
          }
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
    }
  }
  return iVar3;
}

Assistant:

int If_CutLutBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, Delay, DelayMax = -1;
        assert( (If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0) );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            if ( If_CutLeaveNum(pCut) > LutSize && ((pCut->uMaskFunc >> (i << 1)) & 1) )
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 2;
            else
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 1;
        }
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            Delay = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
            DelayMax = Abc_MaxInt( DelayMax, Delay + (int)pPerm[i] );
        }
        return DelayMax;
    }
}